

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hugeint.cpp
# Opt level: O2

hugeint_t duckdb::Hugeint::Multiply<false>(hugeint_t lhs,hugeint_t rhs)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  uint64_t uVar3;
  ulong uVar4;
  uint64_t uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  bool bVar11;
  hugeint_t hVar12;
  
  uVar4 = rhs.upper;
  uVar9 = rhs.lower;
  uVar6 = lhs.upper;
  uVar7 = lhs.lower;
  uVar10 = uVar6;
  if ((long)uVar6 < 0) {
    bVar11 = uVar7 == 0;
    uVar7 = -uVar7;
    uVar10 = ~uVar6 + (ulong)bVar11;
  }
  uVar8 = uVar4;
  if ((long)uVar4 < 0) {
    bVar11 = uVar9 == 0;
    uVar9 = -uVar9;
    uVar8 = ~uVar4 + (ulong)bVar11;
  }
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar9;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = uVar7;
  uVar3 = SUB168(auVar1 * auVar2,0);
  uVar9 = uVar8 * uVar7 + SUB168(auVar1 * auVar2,8) + uVar10 * uVar9;
  uVar5 = uVar3;
  if ((long)(uVar4 ^ uVar6) < 0) {
    uVar5 = -uVar3;
    uVar9 = ~uVar9 + (ulong)(uVar3 == 0);
  }
  hVar12.upper = uVar9;
  hVar12.lower = uVar5;
  return hVar12;
}

Assistant:

hugeint_t Hugeint::Multiply<false>(hugeint_t lhs, hugeint_t rhs) {
	hugeint_t result;
	bool lhs_negative = lhs.upper < 0;
	bool rhs_negative = rhs.upper < 0;
	if (lhs_negative) {
		NegateInPlace<false>(lhs);
	}
	if (rhs_negative) {
		NegateInPlace<false>(rhs);
	}

#if ((__GNUC__ >= 5) || defined(__clang__)) && defined(__SIZEOF_INT128__)
	__uint128_t left = __uint128_t(lhs.lower) + (__uint128_t(lhs.upper) << 64);
	__uint128_t right = __uint128_t(rhs.lower) + (__uint128_t(rhs.upper) << 64);
	__uint128_t result_i128;
	result_i128 = left * right;
	uint64_t upper = uint64_t(result_i128 >> 64);
	result.upper = int64_t(upper);
	result.lower = uint64_t(result_i128 & 0xffffffffffffffff);
#else
	// Multiply code adapted from:
	// https://github.com/calccrypto/uint128_t/blob/master/uint128_t.cpp

	// split values into 4 32-bit parts
	uint64_t top[4] = {uint64_t(lhs.upper) >> 32, uint64_t(lhs.upper) & 0xffffffff, lhs.lower >> 32,
	                   lhs.lower & 0xffffffff};
	uint64_t bottom[4] = {uint64_t(rhs.upper) >> 32, uint64_t(rhs.upper) & 0xffffffff, rhs.lower >> 32,
	                      rhs.lower & 0xffffffff};
	uint64_t products[4][4];

	// multiply each component of the values
	for (auto x = 0; x < 4; x++) {
		for (auto y = 0; y < 4; y++) {
			products[x][y] = top[x] * bottom[y];
		}
	}

	// first row
	uint64_t fourth32 = (products[3][3] & 0xffffffff);
	uint64_t third32 = (products[3][2] & 0xffffffff) + (products[3][3] >> 32);
	uint64_t second32 = (products[3][1] & 0xffffffff) + (products[3][2] >> 32);
	uint64_t first32 = (products[3][0] & 0xffffffff) + (products[3][1] >> 32);

	// second row
	third32 += (products[2][3] & 0xffffffff);
	second32 += (products[2][2] & 0xffffffff) + (products[2][3] >> 32);
	first32 += (products[2][1] & 0xffffffff) + (products[2][2] >> 32);

	// third row
	second32 += (products[1][3] & 0xffffffff);
	first32 += (products[1][2] & 0xffffffff) + (products[1][3] >> 32);

	// fourth row
	first32 += (products[0][3] & 0xffffffff);

	// move carry to next digit
	third32 += fourth32 >> 32;
	second32 += third32 >> 32;
	first32 += second32 >> 32;

	// remove carry from current digit
	fourth32 &= 0xffffffff;
	third32 &= 0xffffffff;
	second32 &= 0xffffffff;
	first32 &= 0xffffffff;

	// combine components
	result.lower = (third32 << 32) | fourth32;
	result.upper = (first32 << 32) | second32;
#endif
	if (lhs_negative ^ rhs_negative) {
		NegateInPlace<false>(result);
	}
	return result;
}